

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_posix_file_storage.cpp
# Opt level: O2

int __thiscall
cppcms::sessions::session_file_storage::remove(session_file_storage *this,char *__filename)

{
  int extraout_EAX;
  locked_file file;
  string local_a0;
  char *local_80 [4];
  undefined1 local_60 [80];
  
  std::__cxx11::string::string((string *)&local_a0,(string *)__filename);
  locked_file::locked_file((locked_file *)local_60,this,&local_a0,false);
  std::__cxx11::string::~string((string *)&local_a0);
  if (-1 < (int)local_60._40_4_) {
    std::__cxx11::string::string((string *)local_80,(string *)(local_60 + 0x30));
    unlink(local_80[0]);
    std::__cxx11::string::~string((string *)local_80);
  }
  locked_file::~locked_file((locked_file *)local_60);
  return extraout_EAX;
}

Assistant:

void session_file_storage::remove(std::string const &sid)
{
	locked_file file(this,sid,false);
	if(file.fd() >= 0)
		::unlink(file.name().c_str());
}